

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool Fossilize::ConcurrentDatabase::write_exported_metadata_for_db
               (DatabaseInterface *iface,uint8_t **data,size_t *size)

{
  uint8_t *puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar4;
  ulong uVar3;
  
  if (iface == (DatabaseInterface *)0x0) {
    if (0xaf < *size) {
      puVar1 = *data;
      puVar1[0] = 'S';
      puVar1[1] = '\x11';
      puVar1[2] = 'Q';
      puVar1[3] = '\x05';
      puVar1[4] = 0xbf;
      puVar1[5] = '\x10';
      puVar1[6] = '\v';
      puVar1[7] = '\0';
      puVar1[8] = 0xb0;
      puVar1[9] = '\0';
      puVar1[10] = '\0';
      puVar1[0xb] = '\0';
      puVar1[0xc] = '\0';
      puVar1[0xd] = '\0';
      puVar1[0xe] = '\0';
      puVar1[0xf] = '\0';
      memset(puVar1 + 0x10,0,0xa0);
      *data = *data + 0xb0;
      sVar4 = *size - 0xb0;
      goto LAB_00146731;
    }
  }
  else {
    iVar2 = (*iface->_vptr_DatabaseInterface[0xb])();
    uVar3 = CONCAT44(extraout_var,iVar2);
    if ((uVar3 <= *size) &&
       (iVar2 = (*iface->_vptr_DatabaseInterface[0xc])(iface,*data,uVar3), (char)iVar2 != '\0')) {
      *data = *data + uVar3;
      sVar4 = *size - uVar3;
LAB_00146731:
      *size = sVar4;
      return true;
    }
  }
  return false;
}

Assistant:

static bool write_exported_metadata_for_db(const DatabaseInterface *iface, uint8_t *&data, size_t &size)
	{
		if (iface)
		{
			size_t required = iface->compute_exported_metadata_size();
			if (required > size)
				return false;

			if (!iface->write_exported_metadata(data, required))
				return false;

			data += required;
			size -= required;
		}
		else
		{
			if (size < sizeof(ExportedMetadataHeader))
				return false;

			auto *header = reinterpret_cast<ExportedMetadataHeader *>(data);
			header->magic = ExportedMetadataMagic;
			header->size = sizeof(*header);
			memset(header->lists, 0, sizeof(header->lists));
			data += sizeof(ExportedMetadataHeader);
			size -= sizeof(ExportedMetadataHeader);
		}

		return true;
	}